

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

int req0_sock_set_resend_tick(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int iVar1;
  undefined8 in_RAX;
  nni_duration local_24 [2];
  nng_duration tick;
  
  local_24[0] = (nni_duration)((ulong)in_RAX >> 0x20);
  iVar1 = nni_copyin_ms(local_24,buf,sz,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x358));
    *(nni_duration *)((long)arg + 0x350) = local_24[0];
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x358));
  }
  return iVar1;
}

Assistant:

static int
req0_sock_set_resend_tick(
    void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	req0_sock   *s = arg;
	nng_duration tick;
	int          rv;

	if ((rv = nni_copyin_ms(&tick, buf, sz, t)) == 0) {
		nni_mtx_lock(&s->mtx);
		s->retry_tick = tick;
		nni_mtx_unlock(&s->mtx);
	}
	return (rv);
}